

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl.cc
# Opt level: O3

void __thiscall
google::protobuf::io::ConcatenatingInputStream::BackUp(ConcatenatingInputStream *this,int count)

{
  undefined4 in_register_00000034;
  LogMessageDebugFatal aLStack_18 [16];
  
  if (0 < this->stream_count_) {
    (*(*this->streams_)->_vptr_ZeroCopyInputStream[3])
              (*this->streams_,CONCAT44(in_register_00000034,count));
    return;
  }
  absl::lts_20240722::log_internal::LogMessageDebugFatal::LogMessageDebugFatal
            (aLStack_18,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/zero_copy_stream_impl.cc"
             ,0x137);
  absl::lts_20240722::log_internal::LogMessage::
  CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
            (aLStack_18,0x23,"Can\'t BackUp() after failed Next().");
  absl::lts_20240722::log_internal::LogMessageDebugFatal::~LogMessageDebugFatal(aLStack_18);
  return;
}

Assistant:

void ConcatenatingInputStream::BackUp(int count) {
  if (stream_count_ > 0) {
    streams_[0]->BackUp(count);
  } else {
    ABSL_DLOG(FATAL) << "Can't BackUp() after failed Next().";
  }
}